

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O1

char * filename_cut(char *line,size_t len)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (line == (char *)0x0) {
    __assert_fail("line",
                  "/workspace/llm4binary/github/license_c_cmakelists/thpatch[P]thtk/thanm.old/thanm.c"
                  ,0x397,"char *filename_cut(char *, size_t)");
  }
  if (len != 0) {
    pcVar5 = line + len;
    do {
      if ((*line != ' ') && (*line != '\t')) goto LAB_001087b6;
      line = line + 1;
      len = len - 1;
    } while (len != 0);
    len = 0;
    line = pcVar5;
  }
LAB_001087b6:
  lVar3 = 0;
  pcVar5 = line;
  pcVar2 = line;
  do {
    if (len == 0) {
LAB_001087eb:
      pcVar2[lVar3] = '\0';
      return line;
    }
    cVar1 = *pcVar5;
    pcVar4 = pcVar2;
    if (((cVar1 != '\t') && (cVar1 != ' ')) && (pcVar4 = pcVar5, cVar1 == '\n')) {
      lVar3 = 1;
      goto LAB_001087eb;
    }
    pcVar5 = pcVar5 + 1;
    len = len - 1;
    pcVar2 = pcVar4;
  } while( true );
}

Assistant:

static char*
filename_cut(
    char *line,
    size_t len)
{
    char *p = line;

    assert(line);

    if(len == 0) {
        return line;
    }

    /* isspace(3) is only asking for trouble; we don't parse Unicode anyway. */
#define is_space(c) (c == ' ' || c == '\t')

    while(len > 0 && is_space(*p)) {
        len--;
        p++;
    }

    char *start = p;
    char *end = p;

    while(len > 0 && *p != '\n') {
        if(!is_space(*p)) {
            end = p;
        }
        len--;
        p++;
    }

#undef is_space

    end[len == 0 ? 0 : 1] = '\0';
    return start;
}